

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall
yy::parser::yy_syntax_error_arguments_
          (parser *this,context *yyctx,symbol_kind_type *yyarg,int yyargn)

{
  bool bVar1;
  symbol_kind_type sVar2;
  int iVar3;
  basic_symbol<yy::parser::by_kind> *this_00;
  symbol_kind_type *local_40;
  int yyn;
  int yyargn_local;
  symbol_kind_type *yyarg_local;
  context *yyctx_local;
  parser *this_local;
  
  this_00 = &context::lookahead(yyctx)->super_basic_symbol<yy::parser::by_kind>;
  bVar1 = basic_symbol<yy::parser::by_kind>::empty(this_00);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    if (yyarg == (symbol_kind_type *)0x0) {
      local_40 = (symbol_kind_type *)0x0;
    }
    else {
      sVar2 = context::token(yyctx);
      *yyarg = sVar2;
      local_40 = yyarg + 1;
    }
    iVar3 = context::expected_tokens(yyctx,local_40,yyargn + -1);
    this_local._4_4_ = iVar3 + 1;
  }
  return this_local._4_4_;
}

Assistant:

int
  parser::yy_syntax_error_arguments_ (const context& yyctx,
                                                 symbol_kind_type yyarg[], int yyargn) const
  {
    /* There are many possibilities here to consider:
       - If this state is a consistent state with a default action, then
         the only way this function was invoked is if the default action
         is an error action.  In that case, don't check for expected
         tokens because there are none.
       - The only way there can be no lookahead present (in yyla) is
         if this state is a consistent state with a default action.
         Thus, detecting the absence of a lookahead is sufficient to
         determine that there is no unexpected or expected token to
         report.  In that case, just report a simple "syntax error".
       - Don't assume there isn't a lookahead just because this state is
         a consistent state with a default action.  There might have
         been a previous inconsistent state, consistent state with a
         non-default action, or user semantic action that manipulated
         yyla.  (However, yyla is currently not documented for users.)
         In the first two cases, it might appear that the current syntax
         error should have been detected in the previous state when
         yy_lac_check was invoked.  However, at that time, there might
         have been a different syntax error that discarded a different
         initial context during error recovery, leaving behind the
         current lookahead.
    */

    if (!yyctx.lookahead ().empty ())
      {
        if (yyarg)
          yyarg[0] = yyctx.token ();
        int yyn = yyctx.expected_tokens (yyarg ? yyarg + 1 : yyarg, yyargn - 1);
        return yyn + 1;
      }
    return 0;
  }